

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O1

void __thiscall CEExecOptions::CEExecOptions(CEExecOptions *this,string *prog_name)

{
  CLOptions::CLOptions(&this->super_CLOptions);
  (this->super_CLOptions)._vptr_CLOptions = (_func_int **)&PTR__CEExecOptions_00166500;
  std::__cxx11::string::string((string *)&this->prog_name_);
  init_members(this);
  SetProgName(this,prog_name);
  return;
}

Assistant:

CEExecOptions(const std::string& prog_name)
        {
            init_members();
            SetProgName(prog_name);
        }